

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

void __thiscall re2::RE2::Init(RE2 *this,StringPiece *pattern,Options *options)

{
  int64_t iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 uVar8;
  bool bVar9;
  int iVar10;
  ParseFlags global_flags;
  Regexp *pRVar11;
  Prog *this_00;
  ostream *poVar12;
  string *psVar13;
  undefined8 uVar14;
  RegexpStatusCode RVar15;
  long *in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  RegexpStatus status;
  re2 local_1f8 [32];
  Regexp *suffix;
  undefined4 local_1d0;
  string local_1c8;
  LogMessage local_1a8;
  
  local_1a8._0_8_ = &status;
  *in_FS_OFFSET = (long)&local_1a8;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  iVar10 = pthread_once(&Init::empty_once._M_once,__once_proxy);
  if (iVar10 != 0) {
    uVar14 = std::__throw_system_error(iVar10);
    LogMessage::~LogMessage(&local_1a8);
    RegexpStatus::~RegexpStatus(&status);
    _Unwind_Resume(uVar14);
  }
  *in_FS_OFFSET = 0;
  *in_FS_OFFSET = 0;
  StringPiece::as_string_abi_cxx11_((string *)&local_1a8,pattern);
  std::__cxx11::string::operator=((string *)this,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  bVar9 = options->never_nl_;
  bVar2 = options->dot_nl_;
  bVar3 = options->never_capture_;
  bVar4 = options->case_sensitive_;
  bVar5 = options->perl_classes_;
  bVar6 = options->word_boundary_;
  bVar7 = options->one_line_;
  (this->options_).literal_ = options->literal_;
  (this->options_).never_nl_ = bVar9;
  (this->options_).dot_nl_ = bVar2;
  (this->options_).never_capture_ = bVar3;
  (this->options_).case_sensitive_ = bVar4;
  (this->options_).perl_classes_ = bVar5;
  (this->options_).word_boundary_ = bVar6;
  (this->options_).one_line_ = bVar7;
  bVar9 = options->posix_syntax_;
  bVar2 = options->longest_match_;
  bVar3 = options->log_errors_;
  uVar8 = options->field_0x7;
  iVar1 = options->max_mem_;
  (this->options_).encoding_ = options->encoding_;
  (this->options_).posix_syntax_ = bVar9;
  (this->options_).longest_match_ = bVar2;
  (this->options_).log_errors_ = bVar3;
  (this->options_).field_0x7 = uVar8;
  (this->options_).max_mem_ = iVar1;
  this->rprog_ = (Prog *)0x0;
  this->entire_regexp_ = (Regexp *)0x0;
  this->suffix_regexp_ = (Regexp *)0x0;
  this->prog_ = (Prog *)0x0;
  this->error_ = empty_string_abi_cxx11_;
  this->error_code_ = NoError;
  this->num_captures_ = -1;
  this->named_groups_ =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *)0x0;
  this->group_names_ =
       (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  status.code_ = kRegexpSuccess;
  status.error_arg_.ptr_ = (char *)0x0;
  status.error_arg_.length_ = 0;
  status.tmp_ = (string *)0x0;
  local_1a8._0_8_ = (this->pattern_)._M_dataplus._M_p;
  local_1a8._8_4_ = SUB84((this->pattern_)._M_string_length,0);
  global_flags = Options::ParseFlags(&this->options_);
  pRVar11 = Regexp::Parse((StringPiece *)&local_1a8,global_flags,&status);
  this->entire_regexp_ = pRVar11;
  if (pRVar11 == (Regexp *)0x0) {
    if ((this->options_).log_errors_ == true) {
      LogMessage::LogMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0xbb,
                 2);
      poVar12 = std::operator<<((ostream *)((long)&local_1a8 + 8),"Error parsing \'");
      suffix = (Regexp *)(this->pattern_)._M_dataplus._M_p;
      local_1d0 = (undefined4)(this->pattern_)._M_string_length;
      trunc_abi_cxx11_(local_1f8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      poVar12 = std::operator<<(poVar12,(string *)local_1f8);
      poVar12 = std::operator<<(poVar12,"\': ");
      RegexpStatus::Text_abi_cxx11_(&local_1c8,&status);
      std::operator<<(poVar12,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)local_1f8);
      LogMessage::~LogMessage(&local_1a8);
    }
    psVar13 = (string *)operator_new(0x20);
    RegexpStatus::Text_abi_cxx11_(psVar13,&status);
    this->error_ = psVar13;
    RVar15 = kRegexpInternalError;
    if (status.code_ < (kRegexpBadUTF8|kRegexpBadEscape)) {
      RVar15 = status.code_;
    }
    this->error_code_ = RVar15;
    StringPiece::as_string_abi_cxx11_((string *)&local_1a8,&status.error_arg_);
    std::__cxx11::string::operator=((string *)&this->error_arg_,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  else {
    (this->prefix_)._M_string_length = 0;
    *(this->prefix_)._M_dataplus._M_p = '\0';
    this->prefix_foldcase_ = false;
    bVar9 = Regexp::RequiredPrefix
                      (this->entire_regexp_,&this->prefix_,&this->prefix_foldcase_,&suffix);
    pRVar11 = suffix;
    if (!bVar9) {
      pRVar11 = Regexp::Incref(this->entire_regexp_);
    }
    this->suffix_regexp_ = pRVar11;
    this_00 = Regexp::CompileToProg(pRVar11,((this->options_).max_mem_ * 2) / 3);
    this->prog_ = this_00;
    if (this_00 == (Prog *)0x0) {
      if ((this->options_).log_errors_ == true) {
        LogMessage::LogMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0xd2,2);
        poVar12 = std::operator<<((ostream *)((long)&local_1a8 + 8),"Error compiling \'");
        local_1c8._M_dataplus._M_p = (this->pattern_)._M_dataplus._M_p;
        local_1c8._M_string_length._0_4_ = (undefined4)(this->pattern_)._M_string_length;
        trunc_abi_cxx11_(local_1f8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        poVar12 = std::operator<<(poVar12,(string *)local_1f8);
        std::operator<<(poVar12,"\'");
        std::__cxx11::string::~string((string *)local_1f8);
        LogMessage::~LogMessage(&local_1a8);
      }
      psVar13 = (string *)operator_new(0x20);
      std::__cxx11::string::string
                ((string *)psVar13,"pattern too large - compile failed",(allocator *)&local_1a8);
      this->error_ = psVar13;
      this->error_code_ = ErrorPatternTooLarge;
    }
    else {
      bVar9 = Prog::IsOnePass(this_00);
      this->is_one_pass_ = bVar9;
    }
  }
  RegexpStatus::~RegexpStatus(&status);
  return;
}

Assistant:

void RE2::Init(const StringPiece& pattern, const Options& options) {
  static std::once_flag empty_once;
  std::call_once(empty_once, []() {
    empty_string = new string;
    empty_named_groups = new map<string, int>;
    empty_group_names = new map<int, string>;
  });

  pattern_ = pattern.as_string();
  options_.Copy(options);
  entire_regexp_ = NULL;
  suffix_regexp_ = NULL;
  prog_ = NULL;
  rprog_ = NULL;
  error_ = empty_string;
  error_code_ = NoError;
  num_captures_ = -1;
  named_groups_ = NULL;
  group_names_ = NULL;

  RegexpStatus status;
  entire_regexp_ = Regexp::Parse(
    pattern_,
    static_cast<Regexp::ParseFlags>(options_.ParseFlags()),
    &status);
  if (entire_regexp_ == NULL) {
    if (options_.log_errors()) {
      LOG(ERROR) << "Error parsing '" << trunc(pattern_) << "': "
                 << status.Text();
    }
    error_ = new string(status.Text());
    error_code_ = RegexpErrorToRE2(status.code());
    error_arg_ = status.error_arg().as_string();
    return;
  }

  prefix_.clear();
  prefix_foldcase_ = false;
  re2::Regexp* suffix;
  if (entire_regexp_->RequiredPrefix(&prefix_, &prefix_foldcase_, &suffix))
    suffix_regexp_ = suffix;
  else
    suffix_regexp_ = entire_regexp_->Incref();

  // Two thirds of the memory goes to the forward Prog,
  // one third to the reverse prog, because the forward
  // Prog has two DFAs but the reverse prog has one.
  prog_ = suffix_regexp_->CompileToProg(options_.max_mem()*2/3);
  if (prog_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Error compiling '" << trunc(pattern_) << "'";
    error_ = new string("pattern too large - compile failed");
    error_code_ = RE2::ErrorPatternTooLarge;
    return;
  }

  // Could delay this until the first match call that
  // cares about submatch information, but the one-pass
  // machine's memory gets cut from the DFA memory budget,
  // and that is harder to do if the DFA has already
  // been built.
  is_one_pass_ = prog_->IsOnePass();
}